

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reliveapp.cpp
# Opt level: O1

void __thiscall relive::ReLiveApp::ReLiveApp(ReLiveApp *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  GLFWmonitor *handle;
  GLFWvidmode *pGVar2;
  string local_178;
  _Any_data local_158;
  code *local_148;
  code *pcStack_140;
  vector<relive::Track,_std::allocator<relive::Track>_> *local_130;
  Stream *local_128;
  vector<relive::Stream,_std::allocator<relive::Stream>_> *local_120;
  vector<relive::Station,_std::allocator<relive::Station>_> *local_118;
  StyleManager *local_110;
  ReLiveDB *local_108;
  undefined1 local_100 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  _Alloc_hider local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  _Alloc_hider local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  _Alloc_hider local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  _Alloc_hider local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  _Alloc_hider local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  local_100._0_8_ = local_100 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_100,anon_var_dwarf_338a3,anon_var_dwarf_338a3 + 0x2a);
  paVar1 = &local_178.field_2;
  local_178._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"reLiveG","");
  ImGui::Application::Application(&this->super_Application,(string *)local_100,&local_178);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != paVar1) {
    operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_100._0_8_ != local_100 + 0x10) {
    operator_delete((void *)local_100._0_8_,local_100._16_8_ + 1);
  }
  (this->super_Application)._vptr_Application = (_func_int **)&PTR__ReLiveApp_003d6da0;
  this->FONT_SIZE = 16.0;
  this->HEADER_FONT_SIZE = 18.0;
  this->TOP_PANEL_HEIGHT = 64.0;
  this->BOTTOM_PANEL_HEIGHT = 100.0;
  this->PANEL_SHADOW = 24.0;
  this->PLAY_BAR_HEIGHT = 24.0;
  this->PLAY_CONTROLS_WIDTH = 150.0;
  this->PLAY_BAR_REL_END = 174.0;
  this->_width = 0.0;
  this->_height = 0.0;
  this->_show_demo_window = true;
  this->_lateSetup = true;
  (this->_mutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->_mutex).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->_mutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->_mutex).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->_mutex).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  local_158._8_8_ = 0;
  pcStack_140 = std::
                _Function_handler<void_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/src/frontend/imgui/reliveapp.cpp:34:12)>
                ::_M_invoke;
  local_148 = std::
              _Function_handler<void_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/src/frontend/imgui/reliveapp.cpp:34:12)>
              ::_M_manager;
  local_178._M_dataplus._M_p = (pointer)paVar1;
  local_158._M_unused._M_object = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"https://api.relive.nu","");
  ghc::net::uri::uri((uri *)local_100,&local_178);
  ReLiveDB::ReLiveDB(&this->_rdb,(function<void_(int)> *)&local_158,(uri *)local_100);
  local_100._0_8_ = &PTR__uri_003d6d80;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_p != &local_40) {
    operator_delete(local_50._M_p,local_40._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_p != &local_60) {
    operator_delete(local_70._M_p,local_60._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_p != &local_80) {
    operator_delete(local_90._M_p,local_80._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_p != &local_a8) {
    operator_delete(local_b8._M_p,local_a8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_p != &local_c8) {
    operator_delete(local_d8._M_p,local_c8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._8_8_ != &local_e8) {
    operator_delete((void *)local_100._8_8_,local_e8._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != paVar1) {
    operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
  }
  if (local_148 != (code *)0x0) {
    (*local_148)(&local_158,&local_158,__destroy_functor);
  }
  this->_lastFetch = 0;
  this->_lastSavepoint = 0;
  this->_lastPlayPos = 0;
  this->_wheelAction = 0;
  local_108 = &this->_rdb;
  Player::Player(&this->_player);
  local_110 = &this->_style;
  this->_headerFont = (ImFont *)0x0;
  this->_monoFont = (ImFont *)0x0;
  (this->_style)._colors.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->_propFont = (ImFont *)0x0;
  (this->_style)._colors.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_style)._colors.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_needsRefresh)._M_base._M_i = true;
  local_118 = &this->_stations;
  local_120 = &this->_streams;
  local_128 = &this->_liveStream;
  *(undefined8 *)&this->_currentPage = 0;
  *(undefined8 *)
   ((long)&(this->_stations).super__Vector_base<relive::Station,_std::allocator<relive::Station>_>.
           _M_impl.super__Vector_impl_data._M_start + 4) = 0;
  *(undefined8 *)
   ((long)&(this->_stations).super__Vector_base<relive::Station,_std::allocator<relive::Station>_>.
           _M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->_stations).super__Vector_base<relive::Station,_std::allocator<relive::Station>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  *(undefined8 *)((long)&this->_activeStation + 4) = 0;
  *(undefined8 *)
   ((long)&(this->_streams).super__Vector_base<relive::Stream,_std::allocator<relive::Stream>_>.
           _M_impl.super__Vector_impl_data._M_start + 4) = 0;
  (this->_streams).super__Vector_base<relive::Stream,_std::allocator<relive::Stream>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_streams).super__Vector_base<relive::Stream,_std::allocator<relive::Stream>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_liveStream)._id = -1;
  (this->_liveStream)._reliveId = 0;
  (this->_liveStream)._stationId = 0;
  (this->_liveStream)._name._M_dataplus._M_p = (pointer)&(this->_liveStream)._name.field_2;
  (this->_liveStream)._name._M_string_length = 0;
  (this->_liveStream)._name.field_2._M_local_buf[0] = '\0';
  (this->_liveStream)._host._M_dataplus._M_p = (pointer)&(this->_liveStream)._host.field_2;
  (this->_liveStream)._host._M_string_length = 0;
  (this->_liveStream)._host.field_2._M_local_buf[0] = '\0';
  (this->_liveStream)._description._M_dataplus._M_p =
       (pointer)&(this->_liveStream)._description.field_2;
  (this->_liveStream)._description._M_string_length = 0;
  (this->_liveStream)._description.field_2._M_local_buf[0] = '\0';
  (this->_liveStream)._size = 0;
  (this->_liveStream)._timestamp = 0;
  (this->_liveStream)._duration = 0;
  (this->_liveStream)._format._M_dataplus._M_p = (pointer)&(this->_liveStream)._format.field_2;
  (this->_liveStream)._format._M_string_length = 0;
  (this->_liveStream)._format.field_2._M_local_buf[0] = '\0';
  (this->_liveStream)._mediaOffset = 0;
  (this->_liveStream)._streamInfoChecksum = 0;
  (this->_liveStream)._chatChecksum = 0;
  (this->_liveStream)._mediaChecksum = 0;
  *(undefined8 *)((long)&(this->_liveStream)._mediaChecksum + 4) = 0;
  *(undefined8 *)((long)&(this->_liveStream)._lastUpdate + 4) = 0;
  (this->_liveStream)._metaInfo._M_dataplus._M_p = (pointer)&(this->_liveStream)._metaInfo.field_2;
  (this->_liveStream)._metaInfo._M_string_length = 0;
  (this->_liveStream)._metaInfo.field_2._M_local_buf[0] = '\0';
  (this->_liveStream)._isLiveStream = false;
  local_130 = &this->_tracks;
  (this->_liveStream)._media.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_liveStream)._media.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_liveStream)._media.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_liveStream)._tracks.super__Vector_base<relive::Track,_std::allocator<relive::Track>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_liveStream)._tracks.super__Vector_base<relive::Track,_std::allocator<relive::Track>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_liveStream)._tracks.super__Vector_base<relive::Track,_std::allocator<relive::Track>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_liveStream)._station.super___shared_ptr<relive::Station,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->_liveStream)._station.super___shared_ptr<relive::Station,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->_activeStream = 0;
  (this->_tracks).super__Vector_base<relive::Track,_std::allocator<relive::Track>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_tracks).super__Vector_base<relive::Track,_std::allocator<relive::Track>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_tracks).super__Vector_base<relive::Track,_std::allocator<relive::Track>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->_activeTrack = 0;
  (this->_activeTrackInfo)._id = -1;
  (this->_activeTrackInfo)._streamId = 0;
  (this->_activeTrackInfo)._name._M_dataplus._M_p = (pointer)&(this->_activeTrackInfo)._name.field_2
  ;
  (this->_activeTrackInfo)._name._M_string_length = 0;
  (this->_activeTrackInfo)._name.field_2._M_local_buf[0] = '\0';
  (this->_activeTrackInfo)._artist._M_dataplus._M_p =
       (pointer)&(this->_activeTrackInfo)._artist.field_2;
  (this->_activeTrackInfo)._artist._M_string_length = 0;
  (this->_activeTrackInfo)._artist.field_2._M_local_buf[0] = '\0';
  (this->_activeTrackInfo)._type = 0;
  (this->_activeTrackInfo)._flags = 0;
  (this->_activeTrackInfo)._time = 0;
  (this->_activeTrackInfo)._lastUpdate = 0;
  (this->_activeTrackInfo)._metaInfo._M_dataplus._M_p =
       (pointer)&(this->_activeTrackInfo)._metaInfo.field_2;
  (this->_activeTrackInfo)._metaInfo._M_string_length = 0;
  (this->_activeTrackInfo)._metaInfo.field_2._M_local_buf[0] = '\0';
  (this->_activeTrackInfo)._isLiveStream = false;
  this->_chatMessageWidth = 0.0;
  (this->_messageSizes).super__Vector_base<ImVec2,_std::allocator<ImVec2>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->_maxNickSize = 0.0;
  this->_chatLogHeight = 0.0;
  (this->_messageSizes).super__Vector_base<ImVec2,_std::allocator<ImVec2>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_messageSizes).super__Vector_base<ImVec2,_std::allocator<ImVec2>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_chat).super__Vector_base<relive::ChatMessage,_std::allocator<relive::ChatMessage>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_chat).super__Vector_base<relive::ChatMessage,_std::allocator<relive::ChatMessage>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_activeTrackInfo)._stream.super___shared_ptr<relive::Stream,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->_chat).super__Vector_base<relive::ChatMessage,_std::allocator<relive::ChatMessage>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_activeTrackInfo)._duration = 0;
  (this->_activeTrackInfo)._stream.super___shared_ptr<relive::Stream,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  this->_chatPosition = -1;
  this->_forceScroll = false;
  this->_progress = 0;
  (this->_searchText)._M_dataplus._M_p = (pointer)&(this->_searchText).field_2;
  (this->_searchText)._M_string_length = 0;
  (this->_searchText).field_2._M_local_buf[0] = '\0';
  this->_darkMode = true;
  this->_receiveBufferBar = false;
  this->_startAtLastPosition = true;
  this->_nameColorSeed = 0x7a69;
  (this->_outputDevice).name._M_dataplus._M_p = (pointer)&(this->_outputDevice).name.field_2;
  (this->_outputDevice).name._M_string_length = 0;
  (this->_outputDevice).name.field_2._M_local_buf[0] = '\0';
  handle = glfwGetPrimaryMonitor();
  pGVar2 = glfwGetVideoMode(handle);
  ImGui::Application::setWindowSize
            (&this->super_Application,(uint)(long)((double)pGVar2->width * 0.5),
             (uint)(long)((double)pGVar2->height * 0.5));
  return;
}

Assistant:

ReLiveApp::ReLiveApp()
    : ImGui::Application(RELIVE_APP_NAME " " RELIVE_VERSION_STRING_LONG " - \u00a9 2020 by Gulrak", "reLiveG")
    , _rdb([&](int percent) { progress(percent); })
    , _lastFetch(0)
    , _activeStation(0)
    , _activeStream(0)
    , _activeTrack(0)
{
    const GLFWvidmode* mode = glfwGetVideoMode(glfwGetPrimaryMonitor());
    setWindowSize(static_cast<unsigned>(mode->width * 0.5), static_cast<unsigned>(mode->height * 0.5));
    // LogManager::instance()->defaultLevel(1);
}